

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall
sqvector<SQVM::CallInfo>::resize
          (sqvector<SQVM::CallInfo> *this,SQUnsignedInteger newsize,CallInfo *fill)

{
  SQUnsignedInteger in_RDX;
  sqvector<SQVM::CallInfo> *in_RSI;
  CallInfo *in_RDI;
  SQUnsignedInteger i;
  CallInfo *in_stack_ffffffffffffffe0;
  sqvector<SQVM::CallInfo> *psVar1;
  
  if (*(sqvector<SQVM::CallInfo> **)&(in_RDI->_closure).super_SQObject < in_RSI) {
    _realloc(in_RSI,in_RDX);
  }
  psVar1 = in_RSI;
  if ((sqvector<SQVM::CallInfo> *)in_RDI->_literals < in_RSI) {
    while ((sqvector<SQVM::CallInfo> *)in_RDI->_literals < in_RSI) {
      SQVM::CallInfo::CallInfo(in_stack_ffffffffffffffe0,in_RDI);
      in_RDI->_literals = (SQObjectPtr *)((long)&(in_RDI->_literals->super_SQObject)._type + 1);
    }
  }
  else {
    for (; in_RSI < (sqvector<SQVM::CallInfo> *)in_RDI->_literals;
        in_RSI = (sqvector<SQVM::CallInfo> *)((long)&in_RSI->_vals + 1)) {
      SQVM::CallInfo::~CallInfo((CallInfo *)0x144a80);
    }
    in_RDI->_literals = (SQObjectPtr *)psVar1;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }